

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_matrix_t *
parasail_matrix_convert_square_to_pssm(parasail_matrix_t *matrix,char *s1,int s1Len)

{
  int iVar1;
  int *__src;
  parasail_matrix_t *ppVar2;
  int *__dest;
  int *piVar3;
  char *__dest_00;
  char *__dest_01;
  long lVar4;
  ulong uVar5;
  int *__dest_02;
  size_t _size;
  size_t __size;
  ulong uVar6;
  
  if (matrix->type == 0) {
    iVar1 = matrix->size;
    ppVar2 = (parasail_matrix_t *)malloc(0x48);
    if (ppVar2 == (parasail_matrix_t *)0x0) {
      __size = 0x48;
    }
    else {
      __dest = (int *)malloc(0x400);
      if (__dest == (int *)0x0) {
        __size = 0x400;
      }
      else {
        __src = matrix->mapper;
        memcpy(__dest,__src,0x400);
        __size = (long)(iVar1 * s1Len) << 2;
        piVar3 = (int *)malloc(__size);
        if (piVar3 != (int *)0x0) {
          lVar4 = (long)iVar1;
          __size = lVar4 + 1;
          __dest_00 = (char *)malloc(__size);
          if (__dest_00 != (char *)0x0) {
            memcpy(__dest_00,matrix->alphabet,__size);
            __size = (size_t)(s1Len + 1);
            __dest_01 = (char *)malloc(__size);
            if (__dest_01 != (char *)0x0) {
              memcpy(__dest_01,s1,__size);
              uVar5 = 0;
              uVar6 = 0;
              __dest_02 = piVar3;
              if (0 < s1Len) {
                uVar6 = (ulong)(uint)s1Len;
              }
              for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
                memcpy(__dest_02,matrix->matrix + __src[(byte)s1[uVar5]] * lVar4,lVar4 * 4);
                __dest_02 = __dest_02 + lVar4;
              }
              ppVar2->name = matrix->name;
              ppVar2->matrix = piVar3;
              ppVar2->mapper = __dest;
              ppVar2->size = iVar1;
              iVar1 = matrix->min;
              ppVar2->max = matrix->max;
              ppVar2->min = iVar1;
              ppVar2->user_matrix = piVar3;
              ppVar2->type = 1;
              ppVar2->length = s1Len;
              ppVar2->alphabet = __dest_00;
              ppVar2->query = __dest_01;
              return ppVar2;
            }
          }
        }
      }
    }
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_convert_square_to_pssm",
            __size);
  }
  else {
    fprintf(_stderr,"%s: attempted to convert non-square matrix to pssm\n",
            "parasail_matrix_convert_square_to_pssm");
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

parasail_matrix_t* parasail_matrix_convert_square_to_pssm(
        const parasail_matrix_t *matrix,
        const char *s1,
        int s1Len)
{
    parasail_matrix_t *retval = NULL;
    size_t matrix_size = matrix->size*s1Len;
    size_t alphabet_size = matrix->size+1;
    int *new_mapper = NULL;
    int *new_matrix = NULL;
    char *new_alphabet = NULL;
    char *new_query = NULL;
    int i;

    PARASAIL_CHECK_NULL(matrix);

    if (matrix->type != PARASAIL_MATRIX_TYPE_SQUARE) {
        fprintf(stderr, "%s: attempted to convert non-square matrix to pssm\n", __func__);
        return NULL;
    }

    PARASAIL_NEW(retval, parasail_matrix_t);

    PARASAIL_CALLOC(new_mapper, int, 256);
    (void)memcpy(new_mapper, matrix->mapper, sizeof(int)*256);

    PARASAIL_CALLOC(new_matrix, int, matrix_size);

    PARASAIL_CALLOC(new_alphabet, char, alphabet_size);
    (void)memcpy(new_alphabet, matrix->alphabet, sizeof(char)*alphabet_size);

    PARASAIL_CALLOC(new_query, char, s1Len+1);
    (void)memcpy(new_query, s1, sizeof(char)*(s1Len+1));

    for (i=0; i<s1Len; ++i) {
        (void)memcpy(
                &new_matrix[matrix->size*i],
                &matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[i]]],
                sizeof(int)*matrix->size);
    }

    retval->name = matrix->name;
    retval->matrix = new_matrix;
    retval->mapper = new_mapper;
    retval->size = matrix->size;
    retval->max = matrix->max;
    retval->min = matrix->min;
    retval->user_matrix = new_matrix;
    retval->type = PARASAIL_MATRIX_TYPE_PSSM;
    retval->length = s1Len;
    retval->alphabet = new_alphabet;
    retval->query = new_query;

    return retval;
}